

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::ZeroObjColSingletonPS::execute
          (ZeroObjColSingletonPS *this,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *x,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *r,
          DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
          *cStatus,DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                   *rStatus,bool isOptimal)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  uint *puVar1;
  pointer pnVar2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  bool bVar4;
  type_conflict5 tVar5;
  VarStatus VVar6;
  double *pdVar7;
  SPxException *this_00;
  SPxInternalCodeException *pSVar8;
  int iVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  cpp_dec_float<50u,int,void> *this_01;
  cpp_dec_float<50U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  double local_660;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  scale2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  z1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_438;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_378;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2f8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  int local_290;
  undefined1 local_28c;
  undefined8 local_288;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_278;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  int local_210;
  undefined1 local_20c;
  undefined8 local_208;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1f8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_148;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a0;
  cpp_dec_float<50U,_int,_void> local_68;
  
  iVar9 = this->m_j;
  if (iVar9 != this->m_old_j) {
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar2[this->m_old_j].m_backend,&pnVar2[iVar9].m_backend);
    pnVar2 = (r->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&pnVar2[this->m_old_j].m_backend,&pnVar2[this->m_j].m_backend);
    iVar9 = this->m_j;
    cStatus->data[this->m_old_j] = cStatus->data[iVar9];
  }
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::operator[](&aij,&(this->m_row).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,iVar9);
  iVar9 = this->m_i;
  pnVar2 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1f8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 8);
  local_1f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&pnVar2[iVar9].m_backend.data;
  local_1f8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2);
  puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
  local_1f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_1f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_1f8.m_backend.exp = pnVar2[iVar9].m_backend.exp;
  local_1f8.m_backend.neg = pnVar2[iVar9].m_backend.neg;
  local_1f8.m_backend.fpclass = pnVar2[iVar9].m_backend.fpclass;
  local_1f8.m_backend.prec_elem = pnVar2[iVar9].m_backend.prec_elem;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_68,1e-06,(type *)0x0);
  bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_1f8,
                     (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_68);
  this_01 = (cpp_dec_float<50u,int,void> *)
            ((s->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start + this->m_i);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=(this_01,0.0);
  }
  else {
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&scale1.m_backend,*pdVar7,(type *)0x0);
    tVar5 = boost::multiprecision::operator>=
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)this_01,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&scale1.m_backend);
    if (tVar5) {
      this_00 = (SPxException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string
                ((string *)&scale1,"Simplifier: infinite activities - aborting unsimplification",
                 (allocator *)&scale2);
      SPxException::SPxException(this_00,(string *)&scale1);
      __cxa_throw(this_00,&SPxException::typeinfo,SPxException::~SPxException);
    }
  }
  local_238 = *(undefined8 *)(this->m_lhs).m_backend.data._M_elems;
  uStack_230 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 2);
  local_228 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 4);
  uStack_220 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 6);
  local_218 = *(undefined8 *)((this->m_lhs).m_backend.data._M_elems + 8);
  local_210 = (this->m_lhs).m_backend.exp;
  local_20c = (this->m_lhs).m_backend.neg;
  local_208._0_4_ = (this->m_lhs).m_backend.fpclass;
  local_208._4_4_ = (this->m_lhs).m_backend.prec_elem;
  iVar9 = this->m_i;
  pnVar3 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_278.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar3[iVar9].m_backend.data._M_elems + 8);
  local_278.m_backend.data._M_elems._0_8_ = *(undefined8 *)pnVar3[iVar9].m_backend.data._M_elems;
  local_278.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar3[iVar9].m_backend.data._M_elems + 2);
  puVar1 = pnVar3[iVar9].m_backend.data._M_elems + 4;
  local_278.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_278.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_278.m_backend.exp = pnVar3[iVar9].m_backend.exp;
  local_278.m_backend.neg = pnVar3[iVar9].m_backend.neg;
  local_278.m_backend.fpclass = pnVar3[iVar9].m_backend.fpclass;
  local_278.m_backend.prec_elem = pnVar3[iVar9].m_backend.prec_elem;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale1,(soplex *)&local_238,&local_278,pnVar3);
  local_2b8 = *(undefined8 *)(this->m_rhs).m_backend.data._M_elems;
  uStack_2b0 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 2);
  local_2a8 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 4);
  uStack_2a0 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 6);
  local_298 = *(undefined8 *)((this->m_rhs).m_backend.data._M_elems + 8);
  local_290 = (this->m_rhs).m_backend.exp;
  local_28c = (this->m_rhs).m_backend.neg;
  local_288._0_4_ = (this->m_rhs).m_backend.fpclass;
  local_288._4_4_ = (this->m_rhs).m_backend.prec_elem;
  iVar9 = this->m_i;
  pnVar3 = (s->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_2f8.m_backend.data._M_elems._32_8_ =
       *(undefined8 *)(pnVar3[iVar9].m_backend.data._M_elems + 8);
  local_2f8.m_backend.data._M_elems._0_8_ = *(undefined8 *)pnVar3[iVar9].m_backend.data._M_elems;
  local_2f8.m_backend.data._M_elems._8_8_ =
       *(undefined8 *)(pnVar3[iVar9].m_backend.data._M_elems + 2);
  puVar1 = pnVar3[iVar9].m_backend.data._M_elems + 4;
  local_2f8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
  local_2f8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
  local_2f8.m_backend.exp = pnVar3[iVar9].m_backend.exp;
  local_2f8.m_backend.neg = pnVar3[iVar9].m_backend.neg;
  local_2f8.m_backend.fpclass = pnVar3[iVar9].m_backend.fpclass;
  local_2f8.m_backend.prec_elem = pnVar3[iVar9].m_backend.prec_elem;
  maxAbs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (&scale2,(soplex *)&local_2b8,&local_2f8,pnVar3);
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar5 = boost::multiprecision::operator<(&scale1,(double *)&z1);
  if (tVar5) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&scale1,1.0);
  }
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0x3ff00000;
  tVar5 = boost::multiprecision::operator<(&scale2,(double *)&z1);
  if (tVar5) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&scale2,1.0);
  }
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 10;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems._32_5_ = 0;
  z2.m_backend.data._M_elems[9]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z2.m_backend,&(this->m_lhs).m_backend,&scale1.m_backend);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,
             &(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&scale1.m_backend);
  z1.m_backend.fpclass = cpp_dec_float_finite;
  z1.m_backend.prec_elem = 10;
  z1.m_backend.data._M_elems[0] = 0;
  z1.m_backend.data._M_elems[1] = 0;
  z1.m_backend.data._M_elems[2] = 0;
  z1.m_backend.data._M_elems[3] = 0;
  z1.m_backend.data._M_elems[4] = 0;
  z1.m_backend.data._M_elems[5] = 0;
  z1.m_backend.data._M_elems[6] = 0;
  z1.m_backend.data._M_elems[7] = 0;
  z1.m_backend.data._M_elems._32_5_ = 0;
  z1.m_backend.data._M_elems[9]._1_3_ = 0;
  z1.m_backend.exp = 0;
  z1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z1.m_backend,&z2.m_backend,&result_1.m_backend);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&(this->m_rhs).m_backend,&scale2.m_backend);
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 10;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems._32_5_ = 0;
  result_4.m_backend.data._M_elems[9]._1_3_ = 0;
  result_4.m_backend.exp = 0;
  result_4.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_4.m_backend,
             &(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&scale2.m_backend);
  z2.m_backend.fpclass = cpp_dec_float_finite;
  z2.m_backend.prec_elem = 10;
  z2.m_backend.data._M_elems[0] = 0;
  z2.m_backend.data._M_elems[1] = 0;
  z2.m_backend.data._M_elems[2] = 0;
  z2.m_backend.data._M_elems[3] = 0;
  z2.m_backend.data._M_elems[4] = 0;
  z2.m_backend.data._M_elems[5] = 0;
  z2.m_backend.data._M_elems[6] = 0;
  z2.m_backend.data._M_elems[7] = 0;
  z2.m_backend.data._M_elems._32_5_ = 0;
  z2.m_backend.data._M_elems[9]._1_3_ = 0;
  z2.m_backend.exp = 0;
  z2.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&z2.m_backend,&result_1.m_backend,&result_4.m_backend);
  local_338.m_backend.data._M_elems[0] = z1.m_backend.data._M_elems[0];
  local_338.m_backend.data._M_elems[1] = z1.m_backend.data._M_elems[1];
  local_338.m_backend.data._M_elems[2] = z1.m_backend.data._M_elems[2];
  local_338.m_backend.data._M_elems[3] = z1.m_backend.data._M_elems[3];
  local_338.m_backend.data._M_elems[4] = z1.m_backend.data._M_elems[4];
  local_338.m_backend.data._M_elems[5] = z1.m_backend.data._M_elems[5];
  local_338.m_backend.data._M_elems[6] = z1.m_backend.data._M_elems[6];
  local_338.m_backend.data._M_elems[7] = z1.m_backend.data._M_elems[7];
  local_338.m_backend.data._M_elems[9]._1_3_ = z1.m_backend.data._M_elems[9]._1_3_;
  local_338.m_backend.data._M_elems._32_5_ = z1.m_backend.data._M_elems._32_5_;
  local_338.m_backend.exp = z1.m_backend.exp;
  local_338.m_backend.neg = z1.m_backend.neg;
  local_338.m_backend.fpclass = z1.m_backend.fpclass;
  local_338.m_backend.prec_elem = z1.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_a0,this);
  bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_338,&local_a0);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&z1,0.0);
  }
  local_378.m_backend.data._M_elems[9]._1_3_ = z2.m_backend.data._M_elems[9]._1_3_;
  local_378.m_backend.data._M_elems._32_5_ = z2.m_backend.data._M_elems._32_5_;
  local_378.m_backend.data._M_elems[4] = z2.m_backend.data._M_elems[4];
  local_378.m_backend.data._M_elems[5] = z2.m_backend.data._M_elems[5];
  local_378.m_backend.data._M_elems[6] = z2.m_backend.data._M_elems[6];
  local_378.m_backend.data._M_elems[7] = z2.m_backend.data._M_elems[7];
  local_378.m_backend.data._M_elems[0] = z2.m_backend.data._M_elems[0];
  local_378.m_backend.data._M_elems[1] = z2.m_backend.data._M_elems[1];
  local_378.m_backend.data._M_elems[2] = z2.m_backend.data._M_elems[2];
  local_378.m_backend.data._M_elems[3] = z2.m_backend.data._M_elems[3];
  local_378.m_backend.exp = z2.m_backend.exp;
  local_378.m_backend.neg = z2.m_backend.neg;
  local_378.m_backend.fpclass = z2.m_backend.fpclass;
  local_378.m_backend.prec_elem = z2.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[7])(&local_d8,this);
  bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_378,&local_d8);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&z2,0.0);
  }
  result_8.m_backend.data._M_elems._0_8_ = (ulong)result_8.m_backend.data._M_elems[1] << 0x20;
  tVar5 = boost::multiprecision::operator>(&aij,(int *)&result_8);
  if (tVar5) {
    pcVar11 = &z1.m_backend;
    pcVar10 = &scale1.m_backend;
  }
  else {
    pcVar11 = &z2.m_backend;
    pcVar10 = &scale2.m_backend;
  }
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 10;
  result_4.m_backend.neg = false;
  result_4.m_backend.exp = 0;
  result_4.m_backend.data._M_elems[9]._1_3_ = 0;
  result_4.m_backend.data._M_elems._32_5_ = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_4.m_backend,pcVar11,pcVar10);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 10;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems._32_5_ = 0;
  result_1.m_backend.data._M_elems[9]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_1.m_backend,&result_4.m_backend,&aij.m_backend);
  result_10.m_backend.data._M_elems._0_8_ = (ulong)result_10.m_backend.data._M_elems[1] << 0x20;
  tVar5 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&aij.m_backend,(int *)&result_10);
  if (tVar5) {
    pcVar11 = &z2.m_backend;
    pcVar10 = &scale2.m_backend;
  }
  else {
    pcVar11 = &z1.m_backend;
    pcVar10 = &scale1.m_backend;
  }
  result_8.m_backend.fpclass = cpp_dec_float_finite;
  result_8.m_backend.prec_elem = 10;
  result_8.m_backend.neg = false;
  result_8.m_backend.exp = 0;
  result_8.m_backend.data._M_elems[9]._1_3_ = 0;
  result_8.m_backend.data._M_elems._32_5_ = 0;
  result_8.m_backend.data._M_elems[7]._1_3_ = 0;
  result_8.m_backend.data._M_elems._24_5_ = 0;
  result_8.m_backend.data._M_elems[4] = 0;
  result_8.m_backend.data._M_elems[5] = 0;
  result_8.m_backend.data._M_elems[2] = 0;
  result_8.m_backend.data._M_elems[3] = 0;
  result_8.m_backend.data._M_elems[0] = 0;
  result_8.m_backend.data._M_elems[1] = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_8.m_backend,pcVar11,pcVar10);
  result_4.m_backend.fpclass = cpp_dec_float_finite;
  result_4.m_backend.prec_elem = 10;
  result_4.m_backend.data._M_elems[0] = 0;
  result_4.m_backend.data._M_elems[1] = 0;
  result_4.m_backend.data._M_elems[2] = 0;
  result_4.m_backend.data._M_elems[3] = 0;
  result_4.m_backend.data._M_elems[4] = 0;
  result_4.m_backend.data._M_elems[5] = 0;
  result_4.m_backend.data._M_elems[6] = 0;
  result_4.m_backend.data._M_elems[7] = 0;
  result_4.m_backend.data._M_elems._32_5_ = 0;
  result_4.m_backend.data._M_elems[9]._1_3_ = 0;
  result_4.m_backend.exp = 0;
  result_4.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_4.m_backend,&result_8.m_backend,&aij.m_backend);
  local_3b8.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
  local_3b8.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
  local_3b8.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
  local_3b8.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
  local_3b8.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
  local_3b8.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
  local_3b8.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
  local_3b8.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
  local_3b8.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
  local_3b8.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
  local_3b8.m_backend.exp = result_1.m_backend.exp;
  local_3b8.m_backend.neg = result_1.m_backend.neg;
  local_3b8.m_backend.fpclass = result_1.m_backend.fpclass;
  local_3b8.m_backend.prec_elem = result_1.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_110,this);
  bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_3b8,&local_110);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_1,0.0);
  }
  local_3f8.m_backend.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
  local_3f8.m_backend.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
  local_3f8.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
  local_3f8.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
  local_3f8.m_backend.data._M_elems[6] = result_4.m_backend.data._M_elems[6];
  local_3f8.m_backend.data._M_elems[7] = result_4.m_backend.data._M_elems[7];
  local_3f8.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
  local_3f8.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
  local_3f8.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
  local_3f8.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
  local_3f8.m_backend.exp = result_4.m_backend.exp;
  local_3f8.m_backend.neg = result_4.m_backend.neg;
  local_3f8.m_backend.fpclass = result_4.m_backend.fpclass;
  local_3f8.m_backend.prec_elem = result_4.m_backend.prec_elem;
  (*(this->super_PostStep)._vptr_PostStep[6])(&local_148,this);
  bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    (&local_3f8,&local_148);
  if (bVar4) {
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&result_4,0.0);
  }
  switch(rStatus->data[this->m_i]) {
  case ON_UPPER:
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_8.m_backend,-*pdVar7,(type *)0x0);
    tVar5 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_8.m_backend);
    if (tVar5) {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_10.m_backend,*pdVar7,(type *)0x0);
      tVar5 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_10.m_backend);
      if (tVar5) {
LAB_002afd77:
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)
                   ((x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->m_j),0.0);
        cStatus->data[this->m_j] = ZERO;
        goto LAB_002b02b9;
      }
    }
    bVar4 = boost::multiprecision::operator==(&this->m_lower,&this->m_upper);
    if (!bVar4) {
      result_8.m_backend.data._M_elems._0_8_ =
           result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar5 = boost::multiprecision::operator>(&aij,(int *)&result_8);
      if (!tVar5) {
        result_8.m_backend.data._M_elems._0_8_ =
             result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar5 = boost::multiprecision::operator<(&aij,(int *)&result_8);
        if (!tVar5) {
          pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&result_8,"XMAISM02 This should never happen.",
                     (allocator *)&result_10);
          SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result_8);
          __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
LAB_002b028e:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  (&(x->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                   &(this->m_upper).m_backend);
        cStatus->data[this->m_j] = ON_UPPER;
        goto LAB_002b02b9;
      }
LAB_002b0182:
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
                 &(this->m_lower).m_backend);
      cStatus->data[this->m_j] = ON_LOWER;
      goto LAB_002b02b9;
    }
    break;
  case ON_LOWER:
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_8.m_backend,-*pdVar7,(type *)0x0);
    tVar5 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_8.m_backend);
    if (tVar5) {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_10.m_backend,*pdVar7,(type *)0x0);
      tVar5 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_10.m_backend);
      if (tVar5) goto LAB_002afd77;
    }
    bVar4 = boost::multiprecision::operator==(&this->m_lower,&this->m_upper);
    if (!bVar4) {
      result_8.m_backend.data._M_elems._0_8_ =
           result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar5 = boost::multiprecision::operator>(&aij,(int *)&result_8);
      if (tVar5) goto LAB_002b028e;
      result_8.m_backend.data._M_elems._0_8_ =
           result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
      tVar5 = boost::multiprecision::operator<(&aij,(int *)&result_8);
      if (!tVar5) {
        pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&result_8,"XMAISM01 This should never happen.",(allocator *)&result_10)
        ;
        SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result_8);
        __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
      }
      goto LAB_002b0182;
    }
    break;
  case FIXED:
    pdVar7 = (double *)infinity();
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (&result_8.m_backend,-*pdVar7,(type *)0x0);
    tVar5 = boost::multiprecision::operator<=
                      (&this->m_lower,
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&result_8.m_backend);
    if (tVar5) {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_10.m_backend,*pdVar7,(type *)0x0);
      tVar5 = boost::multiprecision::operator>=
                        (&this->m_upper,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_10.m_backend);
      if (tVar5) goto LAB_002afd77;
    }
    result_10.m_backend.fpclass = cpp_dec_float_finite;
    result_10.m_backend.prec_elem = 10;
    result_10.m_backend.data._M_elems[0] = 0;
    result_10.m_backend.data._M_elems[1] = 0;
    result_10.m_backend.data._M_elems[2] = 0;
    result_10.m_backend.data._M_elems[3] = 0;
    result_10.m_backend.data._M_elems[4] = 0;
    result_10.m_backend.data._M_elems[5] = 0;
    result_10.m_backend.data._M_elems._24_5_ = 0;
    result_10.m_backend.data._M_elems[7]._1_3_ = 0;
    result_10.m_backend.data._M_elems._32_5_ = 0;
    result_10.m_backend._37_8_ = 0;
    boost::multiprecision::default_ops::
    eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              (&result_10.m_backend,&(this->m_lower).m_backend,&(this->m_upper).m_backend);
    local_660 = 2.0;
    result_8.m_backend.fpclass = cpp_dec_float_finite;
    result_8.m_backend.prec_elem = 10;
    result_8.m_backend.data._M_elems[0] = 0;
    result_8.m_backend.data._M_elems[1] = 0;
    result_8.m_backend.data._M_elems[2] = 0;
    result_8.m_backend.data._M_elems[3] = 0;
    result_8.m_backend.data._M_elems[4] = 0;
    result_8.m_backend.data._M_elems[5] = 0;
    result_8.m_backend.data._M_elems._24_5_ = 0;
    result_8.m_backend.data._M_elems[7]._1_3_ = 0;
    result_8.m_backend.data._M_elems._32_5_ = 0;
    result_8.m_backend.data._M_elems[9]._1_3_ = 0;
    result_8.m_backend.exp = 0;
    result_8.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
              (&result_8.m_backend,&result_10.m_backend,&local_660);
    iVar9 = this->m_j;
    pnVar2 = (x->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *(ulong *)(pnVar2[iVar9].m_backend.data._M_elems + 8) =
         CONCAT35(result_8.m_backend.data._M_elems[9]._1_3_,result_8.m_backend.data._M_elems._32_5_)
    ;
    puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
    *(undefined8 *)puVar1 = result_8.m_backend.data._M_elems._16_8_;
    *(ulong *)(puVar1 + 2) =
         CONCAT35(result_8.m_backend.data._M_elems[7]._1_3_,result_8.m_backend.data._M_elems._24_5_)
    ;
    *(undefined8 *)&pnVar2[iVar9].m_backend.data = result_8.m_backend.data._M_elems._0_8_;
    *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2) =
         result_8.m_backend.data._M_elems._8_8_;
    pnVar2[iVar9].m_backend.exp = result_8.m_backend.exp;
    pnVar2[iVar9].m_backend.neg = result_8.m_backend.neg;
    pnVar2[iVar9].m_backend.fpclass = result_8.m_backend.fpclass;
    pnVar2[iVar9].m_backend.prec_elem = result_8.m_backend.prec_elem;
    goto LAB_002b014d;
  default:
    pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string
              ((string *)&result_8,"XMAISM04 This should never happen.",(allocator *)&result_10);
    SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result_8);
    __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  case BASIC:
    pnVar3 = &this->m_lower;
    local_438.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 8);
    local_438.m_backend.data._M_elems._0_8_ = *(undefined8 *)(this->m_lower).m_backend.data._M_elems
    ;
    local_438.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 2);
    local_438.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 4);
    local_438.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((this->m_lower).m_backend.data._M_elems + 6);
    local_438.m_backend.exp = (this->m_lower).m_backend.exp;
    local_438.m_backend.neg = (this->m_lower).m_backend.neg;
    local_438.m_backend.fpclass = (this->m_lower).m_backend.fpclass;
    local_438.m_backend.prec_elem = (this->m_lower).m_backend.prec_elem;
    local_478.m_backend.data._M_elems[0] = result_1.m_backend.data._M_elems[0];
    local_478.m_backend.data._M_elems[1] = result_1.m_backend.data._M_elems[1];
    local_478.m_backend.data._M_elems[2] = result_1.m_backend.data._M_elems[2];
    local_478.m_backend.data._M_elems[3] = result_1.m_backend.data._M_elems[3];
    local_478.m_backend.data._M_elems[4] = result_1.m_backend.data._M_elems[4];
    local_478.m_backend.data._M_elems[5] = result_1.m_backend.data._M_elems[5];
    local_478.m_backend.data._M_elems[6] = result_1.m_backend.data._M_elems[6];
    local_478.m_backend.data._M_elems[7] = result_1.m_backend.data._M_elems[7];
    local_478.m_backend.data._M_elems[9]._1_3_ = result_1.m_backend.data._M_elems[9]._1_3_;
    local_478.m_backend.data._M_elems._32_5_ = result_1.m_backend.data._M_elems._32_5_;
    local_478.m_backend.exp = result_1.m_backend.exp;
    local_478.m_backend.neg = result_1.m_backend.neg;
    local_478.m_backend.fpclass = result_1.m_backend.fpclass;
    local_478.m_backend.prec_elem = result_1.m_backend.prec_elem;
    (*(this->super_PostStep)._vptr_PostStep[6])(&local_180,this);
    bVar4 = GErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_438,&local_478,&local_180);
    if (bVar4) {
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_8.m_backend,-*pdVar7,(type *)0x0);
      tVar5 = boost::multiprecision::operator>
                        (pnVar3,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&result_8.m_backend);
      if (!tVar5) goto LAB_002afda7;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                (&(x->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,&pnVar3->m_backend)
      ;
      bVar4 = boost::multiprecision::operator==(pnVar3,&this->m_upper);
      VVar6 = bVar4 + ON_LOWER;
LAB_002afebf:
      cStatus->data[this->m_j] = VVar6;
    }
    else {
LAB_002afda7:
      local_4b8.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 8);
      local_4b8.m_backend.data._M_elems._0_8_ =
           *(undefined8 *)(this->m_upper).m_backend.data._M_elems;
      local_4b8.m_backend.data._M_elems._8_8_ =
           *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 2);
      local_4b8.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 4);
      local_4b8.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((this->m_upper).m_backend.data._M_elems + 6);
      local_4b8.m_backend.exp = (this->m_upper).m_backend.exp;
      local_4b8.m_backend.neg = (this->m_upper).m_backend.neg;
      local_4b8.m_backend.fpclass = (this->m_upper).m_backend.fpclass;
      local_4b8.m_backend.prec_elem = (this->m_upper).m_backend.prec_elem;
      local_4f8.m_backend.data._M_elems[0] = result_4.m_backend.data._M_elems[0];
      local_4f8.m_backend.data._M_elems[1] = result_4.m_backend.data._M_elems[1];
      local_4f8.m_backend.data._M_elems[2] = result_4.m_backend.data._M_elems[2];
      local_4f8.m_backend.data._M_elems[3] = result_4.m_backend.data._M_elems[3];
      local_4f8.m_backend.data._M_elems[4] = result_4.m_backend.data._M_elems[4];
      local_4f8.m_backend.data._M_elems[5] = result_4.m_backend.data._M_elems[5];
      local_4f8.m_backend.data._M_elems[6] = result_4.m_backend.data._M_elems[6];
      local_4f8.m_backend.data._M_elems[7] = result_4.m_backend.data._M_elems[7];
      local_4f8.m_backend.data._M_elems[9]._1_3_ = result_4.m_backend.data._M_elems[9]._1_3_;
      local_4f8.m_backend.data._M_elems._32_5_ = result_4.m_backend.data._M_elems._32_5_;
      local_4f8.m_backend.exp = result_4.m_backend.exp;
      local_4f8.m_backend.neg = result_4.m_backend.neg;
      local_4f8.m_backend.fpclass = result_4.m_backend.fpclass;
      local_4f8.m_backend.prec_elem = result_4.m_backend.prec_elem;
      (*(this->super_PostStep)._vptr_PostStep[6])(&local_1b8,this);
      bVar4 = LErel<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_4b8,&local_4f8,&local_1b8);
      if (bVar4) {
        v = &this->m_upper;
        pdVar7 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_8.m_backend,*pdVar7,(type *)0x0);
        tVar5 = boost::multiprecision::operator<
                          (v,(number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&result_8.m_backend);
        if (tVar5) {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    (&(x->val).
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,&v->m_backend);
          bVar4 = boost::multiprecision::operator==(pnVar3,v);
          VVar6 = (uint)bVar4 * 2;
          goto LAB_002afebf;
        }
      }
      pdVar7 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                (&result_8.m_backend,-*pdVar7,(type *)0x0);
      tVar5 = boost::multiprecision::operator>
                        (&result_1,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&result_8.m_backend);
      if (tVar5) {
        iVar9 = this->m_j;
        pnVar2 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar2[iVar9].m_backend.data._M_elems + 8) =
             CONCAT35(result_1.m_backend.data._M_elems[9]._1_3_,
                      result_1.m_backend.data._M_elems._32_5_);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = result_1.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT44(result_1.m_backend.data._M_elems[7],result_1.m_backend.data._M_elems[6]);
        *(undefined8 *)&pnVar2[iVar9].m_backend.data = result_1.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2) =
             result_1.m_backend.data._M_elems._8_8_;
        pnVar2[iVar9].m_backend.exp = result_1.m_backend.exp;
        pnVar2[iVar9].m_backend.neg = result_1.m_backend.neg;
        pnVar2[iVar9].m_backend.fpclass = result_1.m_backend.fpclass;
        pnVar2[iVar9].m_backend.prec_elem = result_1.m_backend.prec_elem;
        cStatus->data[this->m_j] = BASIC;
        result_8.m_backend.data._M_elems._0_8_ =
             result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar5 = boost::multiprecision::operator>(&aij,(int *)&result_8);
      }
      else {
        pdVar7 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (&result_8.m_backend,*pdVar7,(type *)0x0);
        tVar5 = boost::multiprecision::operator<
                          (&result_4,
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&result_8.m_backend);
        if (!tVar5) {
          pSVar8 = (SPxInternalCodeException *)__cxa_allocate_exception(0x28);
          std::__cxx11::string::string
                    ((string *)&result_8,"XMAISM03 This should never happen.",
                     (allocator *)&result_10);
          SPxInternalCodeException::SPxInternalCodeException(pSVar8,(string *)&result_8);
          __cxa_throw(pSVar8,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
        }
        iVar9 = this->m_j;
        pnVar2 = (x->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        *(ulong *)(pnVar2[iVar9].m_backend.data._M_elems + 8) =
             CONCAT35(result_4.m_backend.data._M_elems[9]._1_3_,
                      result_4.m_backend.data._M_elems._32_5_);
        puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
        *(undefined8 *)puVar1 = result_4.m_backend.data._M_elems._16_8_;
        *(ulong *)(puVar1 + 2) =
             CONCAT44(result_4.m_backend.data._M_elems[7],result_4.m_backend.data._M_elems[6]);
        *(undefined8 *)&pnVar2[iVar9].m_backend.data = result_4.m_backend.data._M_elems._0_8_;
        *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2) =
             result_4.m_backend.data._M_elems._8_8_;
        pnVar2[iVar9].m_backend.exp = result_4.m_backend.exp;
        pnVar2[iVar9].m_backend.neg = result_4.m_backend.neg;
        pnVar2[iVar9].m_backend.fpclass = result_4.m_backend.fpclass;
        pnVar2[iVar9].m_backend.prec_elem = result_4.m_backend.prec_elem;
        cStatus->data[this->m_j] = BASIC;
        result_8.m_backend.data._M_elems._0_8_ =
             result_8.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar5 = boost::multiprecision::operator>(&aij,(int *)&result_8);
        tVar5 = !tVar5;
      }
      rStatus->data[this->m_i] = (uint)tVar5;
    }
    goto LAB_002b02b9;
  }
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
            (&(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend,
             &(this->m_lower).m_backend);
LAB_002b014d:
  cStatus->data[this->m_j] = FIXED;
LAB_002b02b9:
  result_8.m_backend.fpclass = cpp_dec_float_finite;
  result_8.m_backend.prec_elem = 10;
  result_8.m_backend.data._M_elems[0] = 0;
  result_8.m_backend.data._M_elems[1] = 0;
  result_8.m_backend.data._M_elems[2] = 0;
  result_8.m_backend.data._M_elems[3] = 0;
  result_8.m_backend.data._M_elems[4] = 0;
  result_8.m_backend.data._M_elems[5] = 0;
  result_8.m_backend.data._M_elems._24_5_ = 0;
  result_8.m_backend.data._M_elems[7]._1_3_ = 0;
  result_8.m_backend.data._M_elems._32_5_ = 0;
  result_8.m_backend.data._M_elems[9]._1_3_ = 0;
  result_8.m_backend.exp = 0;
  result_8.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_8.m_backend,&aij.m_backend,
             &(x->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_j].m_backend);
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
            (&(s->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend,&result_8.m_backend);
  local_660 = -1.0;
  result_10.m_backend.fpclass = cpp_dec_float_finite;
  result_10.m_backend.prec_elem = 10;
  result_10.m_backend.data._M_elems[0] = 0;
  result_10.m_backend.data._M_elems[1] = 0;
  result_10.m_backend.data._M_elems[2] = 0;
  result_10.m_backend.data._M_elems[3] = 0;
  result_10.m_backend.data._M_elems[4] = 0;
  result_10.m_backend.data._M_elems[5] = 0;
  result_10.m_backend.data._M_elems._24_5_ = 0;
  result_10.m_backend.data._M_elems[7]._1_3_ = 0;
  result_10.m_backend.data._M_elems._32_5_ = 0;
  result_10.m_backend._37_8_ = 0;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double>
            (&result_10.m_backend,&aij.m_backend,&local_660);
  result_8.m_backend.fpclass = cpp_dec_float_finite;
  result_8.m_backend.prec_elem = 10;
  result_8.m_backend.data._M_elems[0] = 0;
  result_8.m_backend.data._M_elems[1] = 0;
  result_8.m_backend.data._M_elems[2] = 0;
  result_8.m_backend.data._M_elems[3] = 0;
  result_8.m_backend.data._M_elems[4] = 0;
  result_8.m_backend.data._M_elems[5] = 0;
  result_8.m_backend.data._M_elems._24_5_ = 0;
  result_8.m_backend.data._M_elems[7]._1_3_ = 0;
  result_8.m_backend.data._M_elems._32_5_ = 0;
  result_8.m_backend.data._M_elems[9]._1_3_ = 0;
  result_8.m_backend.exp = 0;
  result_8.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&result_8.m_backend,&result_10.m_backend,
             &(y->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->m_i].m_backend);
  iVar9 = this->m_j;
  pnVar2 = (r->val).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)(pnVar2[iVar9].m_backend.data._M_elems + 8) =
       CONCAT35(result_8.m_backend.data._M_elems[9]._1_3_,result_8.m_backend.data._M_elems._32_5_);
  puVar1 = pnVar2[iVar9].m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = result_8.m_backend.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) =
       CONCAT35(result_8.m_backend.data._M_elems[7]._1_3_,result_8.m_backend.data._M_elems._24_5_);
  *(undefined8 *)&pnVar2[iVar9].m_backend.data = result_8.m_backend.data._M_elems._0_8_;
  *(undefined8 *)(pnVar2[iVar9].m_backend.data._M_elems + 2) =
       result_8.m_backend.data._M_elems._8_8_;
  pnVar2[iVar9].m_backend.exp = result_8.m_backend.exp;
  pnVar2[iVar9].m_backend.neg = result_8.m_backend.neg;
  pnVar2[iVar9].m_backend.fpclass = result_8.m_backend.fpclass;
  pnVar2[iVar9].m_backend.prec_elem = result_8.m_backend.prec_elem;
  return;
}

Assistant:

void SPxMainSM<R>::ZeroObjColSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y,
      VectorBase<R>& s, VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the column and corresponding rows:
   if(m_j != m_old_j)
   {
      x[m_old_j] = x[m_j];
      r[m_old_j] = r[m_j];
      cStatus[m_old_j] = cStatus[m_j];
   }

   // primal & basis:
   R aij = m_row[m_j];

   if(isZero(s[m_i], R(1e-6)))
      s[m_i] = 0.0;
   else if(s[m_i] >= R(infinity))
      // this is a fix for a highly ill conditioned instance that is "solved" in presolving (ilaser0 from MINLP, mittelmann)
      throw SPxException("Simplifier: infinite activities - aborting unsimplification");

   R scale1 = maxAbs(m_lhs, s[m_i]);
   R scale2 = maxAbs(m_rhs, s[m_i]);

   if(scale1 < 1.0)
      scale1 = 1.0;

   if(scale2 < 1.0)
      scale2 = 1.0;

   R z1 = (m_lhs / scale1) - (s[m_i] / scale1);
   R z2 = (m_rhs / scale2) - (s[m_i] / scale2);

   if(isZero(z1, this->epsilon()))
      z1 = 0.0;

   if(isZero(z2, this->epsilon()))
      z2 = 0.0;

   R lo = (aij > 0) ? z1 * scale1 / aij : z2 * scale2 / aij;
   R up = (aij > 0) ? z2 * scale2 / aij : z1 * scale1 / aij;

   if(isZero(lo, this->feastol()))
      lo = 0.0;

   if(isZero(up, this->feastol()))
      up = 0.0;

   assert(LErel(lo, up, this->epsilon()));
   SOPLEX_ASSERT_WARN("WMAISM01", isNotZero(aij, R(1.0 / R(infinity))));

   if(rStatus[m_i] == SPxSolverBase<R>::ON_LOWER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else
         throw SPxInternalCodeException("XMAISM01 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::ON_UPPER)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else if(m_lower == m_upper)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::FIXED;
      }
      else if(aij > 0)
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
      }
      else if(aij < 0)
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
      }
      else
         throw SPxInternalCodeException("XMAISM02 This should never happen.");
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::FIXED)
   {
      if(m_lower <= R(-infinity) && m_upper >= R(infinity))
      {
         x[m_j] = 0.0;
         cStatus[m_j] = SPxSolverBase<R>::ZERO;
      }
      else
      {
         assert(EQrel(m_lower, m_upper, this->feastol()));

         x[m_j]        = (m_lower + m_upper) / 2.0;
         cStatus[m_j]  = SPxSolverBase<R>::FIXED;
      }
   }
   else if(rStatus[m_i] == SPxSolverBase<R>::BASIC)
   {
      if(GErel(m_lower, lo, this->feastol()) && m_lower > R(-infinity))
      {
         x[m_j]       = m_lower;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_LOWER;
      }
      else if(LErel(m_upper, up, this->feastol()) && m_upper < R(infinity))
      {
         x[m_j]       = m_upper;
         cStatus[m_j] = (m_lower == m_upper) ? SPxSolverBase<R>::FIXED : SPxSolverBase<R>::ON_UPPER;
      }
      else if(lo > R(-infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = lo;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER);
      }
      else if(up < R(infinity))
      {
         // make m_i non-basic and m_j basic
         x[m_j]       = up;
         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (aij > 0 ? SPxSolverBase<R>::ON_UPPER : SPxSolverBase<R>::ON_LOWER);
      }
      else
         throw SPxInternalCodeException("XMAISM03 This should never happen.");
   }
   else
      throw SPxInternalCodeException("XMAISM04 This should never happen.");

   s[m_i] += aij * x[m_j];

   // dual:
   r[m_j] = -1.0 * aij * y[m_i];

   assert(!isOptimal || (cStatus[m_j] != SPxSolverBase<R>::BASIC || isZero(r[m_j], this->feastol())));

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM21 Dimension doesn't match after this step.");
   }

#endif
}